

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall Nova::Timer::Release_Timer(Timer *this,int id)

{
  value_type local_4;
  
  std::vector<int,_std::allocator<int>_>::push_back(&this->free_timers->data,&local_4);
  return;
}

Assistant:

void Release_Timer(const int id)
    {free_timers->Append(id);}